

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactBvh.cpp
# Opt level: O0

int __thiscall
btBvhTree::_calc_splitting_axis
          (btBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes,int startIndex,int endIndex)

{
  int iVar1;
  GIM_BVH_DATA *pGVar2;
  int in_ECX;
  int in_EDX;
  btAlignedObjectArray<GIM_BVH_DATA> *in_RSI;
  btVector3 diff2;
  btVector3 center_1;
  btVector3 center;
  int numIndices;
  btVector3 variance;
  btVector3 means;
  int i;
  btVector3 *in_stack_ffffffffffffff28;
  btVector3 *v;
  btVector3 *in_stack_ffffffffffffff30;
  btScalar in_stack_ffffffffffffff38;
  btScalar in_stack_ffffffffffffff3c;
  btScalar in_stack_ffffffffffffff40;
  btScalar in_stack_ffffffffffffff44;
  btVector3 local_b4;
  btScalar local_a4 [4];
  undefined4 local_94;
  btScalar local_90 [4];
  float local_80;
  btScalar local_7c [4];
  undefined4 local_6c;
  btVector3 local_68;
  int local_58;
  btScalar local_54;
  btScalar local_50;
  btScalar local_4c;
  btVector3 local_48;
  btScalar local_38;
  btScalar local_34;
  btScalar local_30;
  btVector3 local_2c;
  int local_1c;
  int local_18;
  int local_14;
  btAlignedObjectArray<GIM_BVH_DATA> *local_10;
  
  local_30 = 0.0;
  local_34 = 0.0;
  local_38 = 0.0;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  btVector3::btVector3(&local_2c,&local_30,&local_34,&local_38);
  local_4c = 0.0;
  local_50 = 0.0;
  local_54 = 0.0;
  btVector3::btVector3(&local_48,&local_4c,&local_50,&local_54);
  local_58 = local_18 - local_14;
  for (local_1c = local_14; local_1c < local_18; local_1c = local_1c + 1) {
    local_6c = 0x3f000000;
    pGVar2 = btAlignedObjectArray<GIM_BVH_DATA>::operator[](local_10,local_1c);
    in_stack_ffffffffffffff30 = &(pGVar2->m_bound).m_max;
    btAlignedObjectArray<GIM_BVH_DATA>::operator[](local_10,local_1c);
    local_7c = (btScalar  [4])
               operator+((btVector3 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (btVector3 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
    ;
    local_68 = ::operator*(in_stack_ffffffffffffff30->m_floats,in_stack_ffffffffffffff28);
    btVector3::operator+=(&local_2c,&local_68);
  }
  local_80 = 1.0 / (float)local_58;
  btVector3::operator*=(&local_2c,&local_80);
  for (local_1c = local_14; local_1c < local_18; local_1c = local_1c + 1) {
    local_94 = 0x3f000000;
    pGVar2 = btAlignedObjectArray<GIM_BVH_DATA>::operator[](local_10,local_1c);
    v = &(pGVar2->m_bound).m_max;
    btAlignedObjectArray<GIM_BVH_DATA>::operator[](local_10,local_1c);
    local_a4 = (btScalar  [4])
               operator+((btVector3 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (btVector3 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
    ;
    local_90 = (btScalar  [4])::operator*(in_stack_ffffffffffffff30->m_floats,v);
    local_b4 = operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (btVector3 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
    ;
    local_b4 = ::operator*((btVector3 *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (btVector3 *)
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    in_stack_ffffffffffffff3c = local_b4.m_floats[0];
    in_stack_ffffffffffffff40 = local_b4.m_floats[1];
    in_stack_ffffffffffffff44 = local_b4.m_floats[2];
    btVector3::operator+=(&local_48,&local_b4);
  }
  btVector3::operator*=(&local_48,(btScalar *)&stack0xffffffffffffff38);
  iVar1 = btVector3::maxAxis(&local_48);
  return iVar1;
}

Assistant:

int btBvhTree::_calc_splitting_axis(
	GIM_BVH_DATA_ARRAY & primitive_boxes, int startIndex,  int endIndex)
{

	int i;

	btVector3 means(btScalar(0.),btScalar(0.),btScalar(0.));
	btVector3 variance(btScalar(0.),btScalar(0.),btScalar(0.));
	int numIndices = endIndex-startIndex;

	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(primitive_boxes[i].m_bound.m_max +
					 primitive_boxes[i].m_bound.m_min);
		means+=center;
	}
	means *= (btScalar(1.)/(btScalar)numIndices);

	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(primitive_boxes[i].m_bound.m_max +
					 primitive_boxes[i].m_bound.m_min);
		btVector3 diff2 = center-means;
		diff2 = diff2 * diff2;
		variance += diff2;
	}
	variance *= (btScalar(1.)/	((btScalar)numIndices-1)	);

	return variance.maxAxis();
}